

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> __thiscall
wabt::MakeUnique<wabt::IfExpr,wabt::Location&>(wabt *this,Location *args)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x150);
  puVar4[1] = 0;
  puVar4[2] = 0;
  sVar1 = (args->filename).size_;
  sVar2 = (args->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&args->field_1 + 8);
  puVar4[3] = (args->filename).data_;
  puVar4[4] = sVar1;
  puVar4[5] = sVar2;
  puVar4[6] = uVar3;
  *(undefined4 *)(puVar4 + 7) = 0x13;
  *puVar4 = &PTR__IfExpr_01544f58;
  Block::Block((Block *)(puVar4 + 8));
  puVar4[0x27] = 0;
  puVar4[0x28] = 0;
  puVar4[0x25] = 0;
  puVar4[0x26] = 0;
  puVar4[0x23] = 0;
  puVar4[0x24] = 0;
  *(undefined4 *)(puVar4 + 0x29) = 0;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<wabt::IfExpr,_std::default_delete<wabt::IfExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::IfExpr,_std::default_delete<wabt::IfExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}